

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O3

ssize_t tnt_object_add_uint(tnt_stream *s,uint64_t value)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  ssize_t sVar4;
  char *pcVar5;
  uint uVar6;
  char local_12;
  undefined1 auStack_11 [7];
  char data [10];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  if (value < 0x80) {
    pcVar5 = auStack_11;
  }
  else {
    if (0xff < value) {
      if (value < 0x10000) {
        pcVar5 = auStack_11 + 2;
        local_12 = -0x33;
        _auStack_11 = CONCAT62(stack0xfffffffffffffff1,(ushort)value << 8 | (ushort)value >> 8);
      }
      else if (value >> 0x20 == 0) {
        pcVar5 = auStack_11 + 4;
        local_12 = -0x32;
        uVar6 = (uint)value;
        _auStack_11 = CONCAT44(stack0xfffffffffffffff3,
                               uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                               uVar6 << 0x18);
      }
      else {
        pcVar5 = data + 1;
        local_12 = -0x31;
        _auStack_11 = value >> 0x38 | (value & 0xff000000000000) >> 0x28 |
                      (value & 0xff0000000000) >> 0x18 | (value & 0xff00000000) >> 8 |
                      (value & 0xff000000) << 8 | (value & 0xff0000) << 0x18 |
                      (value & 0xff00) << 0x28 | value << 0x38;
      }
      goto LAB_0010b4e6;
    }
    pcVar5 = auStack_11 + 1;
    local_12 = -0x34;
  }
  pcVar5[-1] = (char)value;
LAB_0010b4e6:
  sVar4 = (*s->write)(s,&local_12,(long)pcVar5 - (long)&local_12);
  return sVar4;
}

Assistant:

ssize_t
tnt_object_add_uint(struct tnt_stream *s, uint64_t value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[10], *end;
	end = mp_encode_uint(data, value);
	return s->write(s, data, end - data);
}